

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

Boxed_Value __thiscall chaiscript::ChaiScript_Basic::use(ChaiScript_Basic *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar1;
  file_not_found_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  unique_lock<chaiscript::detail::threading::shared_mutex> l2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  shared_mutex *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  size_type *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  unique_lock<chaiscript::detail::threading::recursive_mutex> l;
  undefined1 local_40 [16];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          t_filename[8].field_2._M_allocated_capacity;
  local_78 = t_filename + 2;
  local_80 = &t_filename->_M_string_length;
  local_98 = &this->m_mutex;
  if (__lhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((long)&t_filename[8].field_2 + 8)) {
    std::operator+(&appendedpath,__lhs,in_RDX);
    local_88 = __lhs;
    std::unique_lock<std::recursive_mutex>::unique_lock(&l,(mutex_type *)local_78);
    std::unique_lock<std::shared_mutex>::unique_lock(&l2,(mutex_type *)local_80);
    Boxed_Value::Object_Data::get();
    sVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&t_filename[3]._M_string_length,&appendedpath);
    if (sVar1 == 0) {
      std::unique_lock<std::shared_mutex>::unlock(&l2);
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      eval_file((ChaiScript_Basic *)local_40,t_filename,(Exception_Handler *)&appendedpath);
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_40
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
      std::unique_lock<std::shared_mutex>::lock(&l2);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&t_filename[3]._M_string_length,&appendedpath);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&l2);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&l);
    std::__cxx11::string::~string((string *)&appendedpath);
    BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar2.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (file_not_found_error *)__cxa_allocate_exception(0x30);
  exception::file_not_found_error::file_not_found_error(this_00,in_RDX);
  __cxa_throw(this_00,&exception::file_not_found_error::typeinfo,
              exception::file_not_found_error::~file_not_found_error);
}

Assistant:

Boxed_Value use(const std::string &t_filename) {
      for (const auto &path : m_use_paths) {
        const auto appendedpath = path + t_filename;
        try {
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

          Boxed_Value retval;

          if (m_used_files.count(appendedpath) == 0) {
            l2.unlock();
            retval = eval_file(appendedpath);
            l2.lock();
            m_used_files.insert(appendedpath);
          }

          return retval; // return, we loaded it, or it was already loaded
        } catch (const exception::file_not_found_error &e) {
          if (e.filename != appendedpath) {
            // a nested file include failed
            throw;
          }
          // failed to load, try the next path
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);
    }